

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

psa_status_t
psa_mac_setup(psa_mac_operation_t *operation,psa_key_handle_t handle,psa_algorithm_t alg,int is_sign
             )

{
  byte bVar1;
  psa_key_usage_t usage_00;
  int ret_00;
  uint uVar2;
  size_t key_bits_00;
  mbedtls_cipher_info_t *cipher_info_00;
  uint8_t local_5c;
  psa_algorithm_t hash_alg;
  int ret;
  mbedtls_cipher_info_t *cipher_info;
  psa_algorithm_t full_length_alg;
  uint8_t truncated;
  psa_key_usage_t usage;
  size_t key_bits;
  psa_key_slot_t *slot;
  psa_status_t status;
  int is_sign_local;
  psa_algorithm_t alg_local;
  psa_key_handle_t handle_local;
  psa_mac_operation_t *operation_local;
  
  usage_00 = 0x800;
  if (is_sign != 0) {
    usage_00 = 0x400;
  }
  bVar1 = (byte)(alg >> 8) & 0x3f;
  if (operation->alg != 0) {
    return -0x89;
  }
  slot._4_4_ = is_sign;
  status = alg;
  is_sign_local._2_2_ = handle;
  _alg_local = operation;
  slot._0_4_ = psa_mac_init(operation,alg & 0xffffc0ff);
  if ((psa_status_t)slot != 0) {
    return (psa_status_t)slot;
  }
  if (slot._4_4_ != 0) {
    _alg_local->field_0x4 = _alg_local->field_0x4 & 0xef | 0x10;
  }
  slot._0_4_ = psa_get_key_from_slot
                         (is_sign_local._2_2_,(psa_key_slot_t **)&key_bits,usage_00,status);
  if ((psa_status_t)slot != 0) goto LAB_0011494a;
  key_bits_00 = psa_get_key_slot_bits((psa_key_slot_t *)key_bits);
  if ((alg & 0xffffc0ff) == 0x2c00002) {
    cipher_info_00 =
         mbedtls_cipher_info_from_psa
                   (0x2c00002,*(psa_key_type_t *)key_bits,key_bits_00,(mbedtls_cipher_id_t *)0x0);
    if (cipher_info_00 == (mbedtls_cipher_info_t *)0x0) {
      slot._0_4_ = -0x86;
      goto LAB_0011494a;
    }
    _alg_local->mac_size = (uint8_t)cipher_info_00->block_size;
    ret_00 = psa_cmac_setup(_alg_local,key_bits_00,(psa_key_slot_t *)key_bits,cipher_info_00);
    slot._0_4_ = mbedtls_to_psa_error(ret_00);
  }
  else if ((alg & 0x7fc00000) == 0x2800000) {
    uVar2 = status & 0xff;
    if ((uVar2 | 0x1000000) == 0) {
      slot._0_4_ = -0x86;
      goto LAB_0011494a;
    }
    if ((uVar2 | 0x1000000) == 0x1000001) {
      local_5c = '\x10';
    }
    else if ((uVar2 | 0x1000000) == 0x1000002) {
      local_5c = '\x10';
    }
    else if ((uVar2 | 0x1000000) == 0x1000003) {
      local_5c = '\x10';
    }
    else if ((uVar2 | 0x1000000) == 0x1000004) {
      local_5c = '\x14';
    }
    else if ((uVar2 | 0x1000000) == 0x1000005) {
      local_5c = '\x14';
    }
    else if ((uVar2 | 0x1000000) == 0x1000008) {
      local_5c = '\x1c';
    }
    else if ((uVar2 | 0x1000000) == 0x1000009) {
      local_5c = ' ';
    }
    else if ((uVar2 | 0x1000000) == 0x100000a) {
      local_5c = '0';
    }
    else if ((uVar2 | 0x1000000) == 0x100000b) {
      local_5c = '@';
    }
    else if ((uVar2 | 0x1000000) == 0x100000c) {
      local_5c = '\x1c';
    }
    else if ((uVar2 | 0x1000000) == 0x100000d) {
      local_5c = ' ';
    }
    else if ((uVar2 | 0x1000000) == 0x1000010) {
      local_5c = '\x1c';
    }
    else if ((uVar2 | 0x1000000) == 0x1000011) {
      local_5c = ' ';
    }
    else if ((uVar2 | 0x1000000) == 0x1000012) {
      local_5c = '0';
    }
    else {
      local_5c = '\0';
      if ((uVar2 | 0x1000000) == 0x1000013) {
        local_5c = '@';
      }
    }
    _alg_local->mac_size = local_5c;
    if ((_alg_local->mac_size == '\0') || (0x80 < _alg_local->mac_size)) {
      slot._0_4_ = -0x86;
      goto LAB_0011494a;
    }
    if (*(short *)key_bits != 0x1100) {
      slot._0_4_ = -0x87;
      goto LAB_0011494a;
    }
    slot._0_4_ = psa_hmac_setup_internal
                           (&(_alg_local->ctx).hmac,*(uint8_t **)(key_bits + 0x20),
                            *(size_t *)(key_bits + 0x28),uVar2 | 0x1000000);
  }
  else {
    slot._0_4_ = -0x86;
  }
  if ((alg & 0x3f00) != 0) {
    if (bVar1 < 4) {
      slot._0_4_ = -0x86;
    }
    else if (_alg_local->mac_size < bVar1) {
      slot._0_4_ = -0x87;
    }
    else {
      _alg_local->mac_size = bVar1;
    }
  }
LAB_0011494a:
  if ((psa_status_t)slot == 0) {
    _alg_local->field_0x4 = _alg_local->field_0x4 & 0xfe | 1;
  }
  else {
    psa_mac_abort(_alg_local);
  }
  return (psa_status_t)slot;
}

Assistant:

static psa_status_t psa_mac_setup( psa_mac_operation_t *operation,
                                   psa_key_handle_t handle,
                                   psa_algorithm_t alg,
                                   int is_sign )
{
    psa_status_t status;
    psa_key_slot_t *slot;
    size_t key_bits;
    psa_key_usage_t usage =
        is_sign ? PSA_KEY_USAGE_SIGN_HASH : PSA_KEY_USAGE_VERIFY_HASH;
    uint8_t truncated = PSA_MAC_TRUNCATED_LENGTH( alg );
    psa_algorithm_t full_length_alg = PSA_ALG_FULL_LENGTH_MAC( alg );

    /* A context must be freshly initialized before it can be set up. */
    if( operation->alg != 0 )
    {
        return( PSA_ERROR_BAD_STATE );
    }

    status = psa_mac_init( operation, full_length_alg );
    if( status != PSA_SUCCESS )
        return( status );
    if( is_sign )
        operation->is_sign = 1;

    status = psa_get_transparent_key( handle, &slot, usage, alg );
    if( status != PSA_SUCCESS )
        goto exit;
    key_bits = psa_get_key_slot_bits( slot );

#if defined(MBEDTLS_CMAC_C)
    if( full_length_alg == PSA_ALG_CMAC )
    {
        const mbedtls_cipher_info_t *cipher_info =
            mbedtls_cipher_info_from_psa( full_length_alg,
                                          slot->attr.type, key_bits, NULL );
        int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
        if( cipher_info == NULL )
        {
            status = PSA_ERROR_NOT_SUPPORTED;
            goto exit;
        }
        operation->mac_size = cipher_info->block_size;
        ret = psa_cmac_setup( operation, key_bits, slot, cipher_info );
        status = mbedtls_to_psa_error( ret );
    }
    else
#endif /* MBEDTLS_CMAC_C */
#if defined(MBEDTLS_MD_C)
    if( PSA_ALG_IS_HMAC( full_length_alg ) )
    {
        psa_algorithm_t hash_alg = PSA_ALG_HMAC_GET_HASH( alg );
        if( hash_alg == 0 )
        {
            status = PSA_ERROR_NOT_SUPPORTED;
            goto exit;
        }

        operation->mac_size = PSA_HASH_SIZE( hash_alg );
        /* Sanity check. This shouldn't fail on a valid configuration. */
        if( operation->mac_size == 0 ||
            operation->mac_size > sizeof( operation->ctx.hmac.opad ) )
        {
            status = PSA_ERROR_NOT_SUPPORTED;
            goto exit;
        }

        if( slot->attr.type != PSA_KEY_TYPE_HMAC )
        {
            status = PSA_ERROR_INVALID_ARGUMENT;
            goto exit;
        }

        status = psa_hmac_setup_internal( &operation->ctx.hmac,
                                          slot->data.raw.data,
                                          slot->data.raw.bytes,
                                          hash_alg );
    }
    else
#endif /* MBEDTLS_MD_C */
    {
        (void) key_bits;
        status = PSA_ERROR_NOT_SUPPORTED;
    }

    if( truncated == 0 )
    {
        /* The "normal" case: untruncated algorithm. Nothing to do. */
    }
    else if( truncated < 4 )
    {
        /* A very short MAC is too short for security since it can be
         * brute-forced. Ancient protocols with 32-bit MACs do exist,
         * so we make this our minimum, even though 32 bits is still
         * too small for security. */
        status = PSA_ERROR_NOT_SUPPORTED;
    }
    else if( truncated > operation->mac_size )
    {
        /* It's impossible to "truncate" to a larger length. */
        status = PSA_ERROR_INVALID_ARGUMENT;
    }
    else
        operation->mac_size = truncated;

exit:
    if( status != PSA_SUCCESS )
    {
        psa_mac_abort( operation );
    }
    else
    {
        operation->key_set = 1;
    }
    return( status );
}